

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_manager::remove_request(tracker_manager *this,http_tracker_connection *c)

{
  _Map_pointer *pppsVar1;
  _Map_pointer *pppsVar2;
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar3;
  counters *pcVar4;
  size_type sVar5;
  difference_type dVar6;
  long lVar7;
  _Elt_pointer psVar8;
  long lVar9;
  _Map_pointer ppsVar10;
  _Map_pointer ppsVar11;
  _Map_pointer *pppsVar12;
  const_iterator __position;
  _Self local_98;
  _Self local_78;
  const_iterator local_50;
  
  __position._M_current =
       (this->m_http_conns).
       super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_http_conns).
           super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar3 - (long)__position._M_current;
  for (lVar9 = lVar7 >> 6; 0 < lVar9; lVar9 = lVar9 + -1) {
    if (((__position._M_current)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322841;
    if (__position._M_current[1].
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == c) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00322841;
    }
    if (__position._M_current[2].
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == c) {
      __position._M_current = __position._M_current + 2;
      goto LAB_00322841;
    }
    if (__position._M_current[3].
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == c) {
      __position._M_current = __position._M_current + 3;
      goto LAB_00322841;
    }
    __position._M_current = __position._M_current + 4;
    lVar7 = lVar7 + -0x40;
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 == 1) {
LAB_00322828:
    if (((__position._M_current)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr != c) {
      __position._M_current = psVar3;
    }
LAB_00322841:
    if (__position._M_current != psVar3) {
      ::std::
      vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::erase(&this->m_http_conns,__position);
      psVar8 = (this->m_queued).
               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->m_queued).
          super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar8) {
        return;
      }
      local_98._M_cur =
           (_Elt_pointer)
           (psVar8->
           super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
      local_98._M_first =
           (_Elt_pointer)
           (psVar8->
           super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
      (psVar8->
      super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar8->
      super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      ::std::
      deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::pop_front(&this->m_queued);
      ::std::
      vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
      ::emplace_back<std::shared_ptr<libtorrent::aux::http_tracker_connection>>
                ((vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
                  *)&this->m_http_conns,
                 (shared_ptr<libtorrent::aux::http_tracker_connection> *)&local_98);
      (*(((this->m_http_conns).
          super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[3])();
      pcVar4 = this->m_stats_counters;
      sVar5 = ::std::
              deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ::size(&this->m_queued);
      counters::set_value(pcVar4,0x122,sVar5);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_first);
      return;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0032281f:
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr != c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00322828;
      }
      goto LAB_00322841;
    }
    if (lVar7 == 3) {
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr != c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0032281f;
      }
      goto LAB_00322841;
    }
  }
  local_98._M_cur =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_98._M_first =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  pppsVar1 = &local_98._M_node;
  local_98._M_last =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_98._M_node =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_78._M_cur =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pppsVar2 = &local_78._M_node;
  local_78._M_last =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  dVar6 = ::std::operator-(&local_78,&local_98);
  ppsVar11 = local_98._M_node;
  local_50._M_last = local_98._M_last;
  for (lVar7 = dVar6 >> 2; pppsVar12 = pppsVar1, 0 < lVar7; lVar7 = lVar7 + -1) {
    local_50._M_first = local_98._M_first;
    local_50._M_cur = local_98._M_cur;
    if (((local_98._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    local_50._M_cur = local_98._M_cur + 1;
    ppsVar10 = ppsVar11;
    if (local_50._M_cur == local_50._M_last) {
      ppsVar10 = ppsVar11 + 1;
      local_98._M_node = ppsVar10;
      local_50._M_cur = ppsVar11[1];
      local_50._M_last = local_50._M_cur + 0x20;
      local_98._M_first = local_50._M_cur;
      local_98._M_last = local_50._M_last;
    }
    local_50._M_first = local_98._M_first;
    if (((local_50._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    local_50._M_cur = local_50._M_cur + 1;
    ppsVar11 = ppsVar10;
    if (local_50._M_cur == local_50._M_last) {
      ppsVar11 = ppsVar10 + 1;
      local_98._M_node = ppsVar11;
      local_50._M_cur = ppsVar10[1];
      local_50._M_last = local_50._M_cur + 0x20;
      local_98._M_first = local_50._M_cur;
      local_98._M_last = local_50._M_last;
    }
    local_50._M_first = local_98._M_first;
    if (((local_50._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    local_50._M_cur = local_50._M_cur + 1;
    ppsVar10 = ppsVar11;
    if (local_50._M_cur == local_50._M_last) {
      ppsVar10 = ppsVar11 + 1;
      local_98._M_node = ppsVar10;
      local_50._M_cur = ppsVar11[1];
      local_50._M_last = local_50._M_cur + 0x20;
      local_98._M_first = local_50._M_cur;
      local_98._M_last = local_50._M_last;
    }
    local_50._M_first = local_98._M_first;
    if (((local_50._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    local_98._M_cur = local_50._M_cur + 1;
    ppsVar11 = ppsVar10;
    if (local_98._M_cur == local_50._M_last) {
      ppsVar11 = ppsVar10 + 1;
      local_98._M_node = ppsVar11;
      local_98._M_cur = ppsVar10[1];
      local_50._M_last = local_98._M_cur + 0x20;
      local_98._M_first = local_98._M_cur;
      local_98._M_last = local_50._M_last;
    }
  }
  dVar6 = ::std::operator-(&local_78,&local_98);
  ppsVar11 = local_98._M_node;
  local_50._M_cur = local_98._M_cur;
  if (dVar6 == 3) {
    local_50._M_first = local_98._M_first;
    local_50._M_last = local_98._M_last;
    if (((local_98._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    local_50._M_cur = local_98._M_cur + 1;
    if (local_98._M_cur + 1 == local_98._M_last) {
      local_98._M_node = local_98._M_node + 1;
      local_98._M_first = ppsVar11[1];
      local_98._M_last = local_98._M_first + 0x20;
      local_50._M_cur = local_98._M_first;
    }
LAB_00322a74:
    ppsVar11 = local_98._M_node;
    local_50._M_first = local_98._M_first;
    local_50._M_last = local_98._M_last;
    if (((local_50._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00322adc;
    psVar8 = local_50._M_cur + 1;
    if (local_50._M_cur + 1 == local_98._M_last) {
      local_98._M_node = local_98._M_node + 1;
      local_98._M_first = ppsVar11[1];
      local_98._M_last = local_98._M_first + 0x20;
      psVar8 = local_98._M_first;
    }
  }
  else {
    if (dVar6 == 2) goto LAB_00322a74;
    local_50._M_first = local_78._M_first;
    psVar8 = local_98._M_cur;
    local_50._M_cur = local_78._M_cur;
    pppsVar12 = pppsVar2;
    local_50._M_last = local_78._M_last;
    if (dVar6 != 1) goto LAB_00322adc;
  }
  local_50._M_first = local_98._M_first;
  local_50._M_cur = psVar8;
  pppsVar12 = pppsVar1;
  local_50._M_last = local_98._M_last;
  if (((psVar8->
       super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr != c) &&
     (local_50._M_first = local_78._M_first, local_50._M_cur = local_78._M_cur, pppsVar12 = pppsVar2
     , local_50._M_last = local_78._M_last, psVar8 + 1 == local_98._M_last)) {
    local_98._M_node = local_98._M_node + 1;
  }
LAB_00322adc:
  if (local_50._M_cur !=
      (this->m_queued).
      super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_50._M_node = *pppsVar12;
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::erase(&local_98,&this->m_queued,&local_50);
    pcVar4 = this->m_stats_counters;
    sVar5 = ::std::
            deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
            ::size(&this->m_queued);
    counters::set_value(pcVar4,0x122,sVar5);
  }
  return;
}

Assistant:

void tracker_manager::remove_request(aux::http_tracker_connection const* c)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_http_conns.begin(), m_http_conns.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (i != m_http_conns.end())
		{
			m_http_conns.erase(i);
			if (!m_queued.empty())
			{
				auto conn = std::move(m_queued.front());
				m_queued.pop_front();
				m_http_conns.push_back(std::move(conn));
				m_http_conns.back()->start();
				m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
			}
			return;
		}

		auto const j = std::find_if(m_queued.begin(), m_queued.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (j != m_queued.end())
		{
			m_queued.erase(j);
			m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
		}
	}